

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O0

int distribute_start(mixed_segment *segment)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  mixed_buffer *buffer;
  uint32_t i;
  mixed_buffer *in;
  distribute_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  puVar2 = (undefined8 *)plVar1[2];
  if (puVar2 == (undefined8 *)0x0) {
    mixed_err(0x16);
    segment_local._4_4_ = 0;
  }
  else {
    for (buffer._4_4_ = 0; buffer._4_4_ < *(uint *)(plVar1 + 1); buffer._4_4_ = buffer._4_4_ + 1) {
      puVar3 = *(undefined8 **)(*plVar1 + (ulong)buffer._4_4_ * 8);
      *puVar3 = *puVar2;
      *(undefined4 *)(puVar3 + 1) = *(undefined4 *)(puVar2 + 1);
      *(undefined4 *)((long)puVar3 + 0xc) = *(undefined4 *)((long)puVar2 + 0xc);
      *(undefined4 *)(puVar3 + 2) = *(undefined4 *)(puVar2 + 2);
    }
    *(undefined4 *)(plVar1 + 3) = 0;
    segment_local._4_4_ = 1;
  }
  return segment_local._4_4_;
}

Assistant:

int distribute_start(struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;
  struct mixed_buffer *in = data->in;

  if(!in){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }

  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_buffer *buffer = data->out[i];
    buffer->_data = in->_data;
    buffer->size = in->size;
    buffer->read = in->read;
    buffer->write = in->write;
  }

  data->was_available = 0;
  return 1;
}